

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdUpdateConfidentialTxOut
              (void *handle,char *tx_hex_string,uint32_t index,char *asset_string,
              int64_t value_satoshi,char *value_commitment,char *address,char *direct_locking_script
              ,char *nonce,char **tx_string)

{
  bool bVar1;
  undefined1 uVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *in_RCX;
  uint32_t in_EDX;
  char *in_RSI;
  int64_t in_R8;
  char *in_R9;
  Amount AVar5;
  char *in_stack_00000008;
  char *in_stack_00000010;
  char *in_stack_00000018;
  undefined8 *in_stack_00000020;
  CfdException *except;
  exception *std_except;
  Address unconfidential_addr;
  ElementsConfidentialAddress confidential_addr;
  string addr;
  Script locking_script;
  ConfidentialNonce nonce_obj;
  ConfidentialAssetId asset_obj;
  ElementsAddressFactory address_factory;
  ConfidentialValue temp_value;
  ConfidentialValue value;
  ConfidentialTransactionContext ctx;
  string *in_stack_fffffffffffff658;
  ElementsConfidentialAddress *in_stack_fffffffffffff660;
  AddressFactory *in_stack_fffffffffffff668;
  string *in_stack_fffffffffffff670;
  CfdError in_stack_fffffffffffff67c;
  CfdException *in_stack_fffffffffffff680;
  undefined6 in_stack_fffffffffffff690;
  undefined1 in_stack_fffffffffffff696;
  undefined1 in_stack_fffffffffffff697;
  ConfidentialTransactionContext *in_stack_fffffffffffff6b8;
  allocator *paVar6;
  undefined7 in_stack_fffffffffffff6c0;
  string local_880;
  ByteData local_860;
  ByteData local_848;
  allocator local_829;
  string local_828;
  Script local_808;
  Script local_7d0;
  Address local_798;
  Script local_620;
  ElementsConfidentialAddress local_5e8;
  allocator local_431;
  string local_430;
  Script local_410;
  allocator local_3d1;
  string local_3d0;
  ConfidentialNonce local_3b0;
  ConfidentialNonce local_388;
  allocator local_359;
  string local_358;
  ConfidentialAssetId local_338 [2];
  allocator local_2e1;
  string local_2e0;
  ConfidentialValue local_2c0;
  int64_t local_298;
  undefined1 local_290;
  Amount local_288;
  ConfidentialValue local_278;
  ConfidentialValue local_250;
  undefined1 local_222;
  allocator local_221;
  string local_220 [32];
  CfdSourceLocation local_200;
  allocator local_1e1;
  string local_1e0 [32];
  ConfidentialTransaction local_1c0 [2];
  undefined1 local_102;
  allocator local_101;
  string local_100 [32];
  CfdSourceLocation local_e0;
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [32];
  CfdSourceLocation local_a0;
  undefined1 local_82;
  allocator local_81;
  string local_80 [32];
  CfdSourceLocation local_60;
  char *local_38;
  int64_t local_30;
  char *local_28;
  uint32_t local_1c;
  char *local_18;
  int local_4;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (bVar1) {
    local_60.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_60.filename = local_60.filename + 1;
    local_60.line = 0x140;
    local_60.funcname = "CfdUpdateConfidentialTxOut";
    cfd::core::logger::warn<>(&local_60,"tx is null or empty.");
    local_82 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"Failed to parameter. tx is null or empty.",&local_81);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff680,in_stack_fffffffffffff67c,in_stack_fffffffffffff670);
    local_82 = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (in_stack_00000020 == (undefined8 *)0x0) {
    local_a0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_a0.filename = local_a0.filename + 1;
    local_a0.line = 0x146;
    local_a0.funcname = "CfdUpdateConfidentialTxOut";
    cfd::core::logger::warn<>(&local_a0,"tx output is null.");
    local_c2 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"Failed to parameter. tx output is null.",&local_c1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff680,in_stack_fffffffffffff67c,in_stack_fffffffffffff670);
    local_c2 = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_28);
  if (bVar1) {
    local_e0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_e0.filename = local_e0.filename + 1;
    local_e0.line = 0x14c;
    local_e0.funcname = "CfdUpdateConfidentialTxOut";
    cfd::core::logger::warn<>(&local_e0,"asset is null or empty.");
    local_102 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_100,"Failed to parameter. asset is null or empty.",&local_101);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff680,in_stack_fffffffffffff67c,in_stack_fffffffffffff670);
    local_102 = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,local_18,&local_1e1);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)in_stack_fffffffffffff660,in_stack_fffffffffffff658);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  bVar1 = cfd::ConfidentialTransactionContext::HasBlinding(in_stack_fffffffffffff6b8);
  if (bVar1) {
    local_200.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_200.filename = local_200.filename + 1;
    local_200.line = 0x154;
    local_200.funcname = "CfdUpdateConfidentialTxOut";
    cfd::core::logger::warn<>(&local_200,"tx is already blinded.");
    local_222 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_220,"Failed to blinded. this function can use unblind tx only.",&local_221);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff680,in_stack_fffffffffffff67c,in_stack_fffffffffffff670);
    local_222 = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::ConfidentialValue::ConfidentialValue(&local_250);
  bVar1 = cfd::capi::IsEmptyString(local_38);
  if (bVar1) {
    AVar5 = cfd::core::Amount::CreateBySatoshiAmount(local_30);
    local_298 = AVar5.amount_;
    local_290 = AVar5.ignore_check_;
    local_288.amount_ = local_298;
    local_288.ignore_check_ = (bool)local_290;
    cfd::core::ConfidentialValue::ConfidentialValue(&local_278,&local_288);
    cfd::core::ConfidentialValue::operator=(&local_250,&local_278);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x5a5014);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2e0,local_38,&local_2e1);
    cfd::core::ConfidentialValue::ConfidentialValue(&local_2c0,&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
    bVar1 = cfd::core::ConfidentialValue::HasBlinding(&local_2c0);
    if (!bVar1) {
      cfd::core::ConfidentialValue::operator=(&local_250,&local_2c0);
    }
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x5a5189);
  }
  cfd::ElementsAddressFactory::ElementsAddressFactory
            ((ElementsAddressFactory *)
             CONCAT17(in_stack_fffffffffffff697,
                      CONCAT16(in_stack_fffffffffffff696,in_stack_fffffffffffff690)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_358,local_28,&local_359);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(local_338,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator((allocator<char> *)&local_359);
  cfd::core::ConfidentialNonce::ConfidentialNonce(&local_388);
  uVar2 = cfd::capi::IsEmptyString(in_stack_00000018);
  if (!(bool)uVar2) {
    paVar6 = &local_3d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3d0,in_stack_00000018,paVar6);
    cfd::core::ConfidentialNonce::ConfidentialNonce(&local_3b0,&local_3d0);
    cfd::core::ConfidentialNonce::operator=(&local_388,&local_3b0);
    cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x5a52a4);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  }
  cfd::core::Script::Script(&local_410);
  bVar1 = cfd::capi::IsEmptyString(in_stack_00000008);
  if (bVar1) {
    bVar1 = cfd::capi::IsEmptyString(in_stack_00000010);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_828,in_stack_00000010,&local_829);
      cfd::core::Script::Script(&local_808,&local_828);
      cfd::core::Script::operator=(&local_410,&local_808);
      cfd::core::Script::~Script((Script *)in_stack_fffffffffffff660);
      std::__cxx11::string::~string((string *)&local_828);
      std::allocator<char>::~allocator((allocator<char> *)&local_829);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_430,in_stack_00000008,&local_431);
    std::allocator<char>::~allocator((allocator<char> *)&local_431);
    bVar1 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress(&local_430);
    if (bVar1) {
      cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&local_5e8,&local_430);
      cfd::core::ElementsConfidentialAddress::GetLockingScript(&local_620,&local_5e8);
      cfd::core::Script::operator=(&local_410,&local_620);
      cfd::core::Script::~Script((Script *)in_stack_fffffffffffff660);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                (in_stack_fffffffffffff660);
    }
    else {
      cfd::AddressFactory::GetAddress(in_stack_fffffffffffff668,(string *)in_stack_fffffffffffff660)
      ;
      cfd::core::Address::GetLockingScript(&local_7d0,&local_798);
      cfd::core::Script::operator=(&local_410,&local_7d0);
      cfd::core::Script::~Script((Script *)in_stack_fffffffffffff660);
      cfd::core::Address::~Address(&in_stack_fffffffffffff660->unblinded_address_);
    }
    std::__cxx11::string::~string((string *)&local_430);
  }
  cfd::core::ByteData::ByteData(&local_848);
  cfd::core::ByteData::ByteData(&local_860);
  cfd::core::ConfidentialTransaction::SetTxOutCommitment
            (local_1c0,local_1c,local_338,&local_250,&local_388,&local_848,&local_860);
  cfd::core::ByteData::~ByteData((ByteData *)0x5a57ac);
  cfd::core::ByteData::~ByteData((ByteData *)0x5a57b9);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            (&local_880,&local_1c0[0].super_AbstractTransaction);
  pcVar4 = cfd::capi::CreateString((string *)CONCAT17(uVar2,in_stack_fffffffffffff6c0));
  *in_stack_00000020 = pcVar4;
  std::__cxx11::string::~string((string *)&local_880);
  local_4 = 0;
  cfd::core::Script::~Script((Script *)in_stack_fffffffffffff660);
  cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x5a5826);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x5a5833);
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x5a5840);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x5a584d);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)in_stack_fffffffffffff660);
  return local_4;
}

Assistant:

int CfdUpdateConfidentialTxOut(
    void* handle, const char* tx_hex_string, uint32_t index,
    const char* asset_string, int64_t value_satoshi,
    const char* value_commitment, const char* address,
    const char* direct_locking_script, const char* nonce, char** tx_string) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx output is null.");
    }
    if (IsEmptyString(asset_string)) {
      warn(CFD_LOG_SOURCE, "asset is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. asset is null or empty.");
    }

    ConfidentialTransactionContext ctx(tx_hex_string);
    if (ctx.HasBlinding()) {
      warn(CFD_LOG_SOURCE, "tx is already blinded.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to blinded. this function can use unblind tx only.");
    }

    ConfidentialValue value;
    if (IsEmptyString(value_commitment)) {
      value = ConfidentialValue(Amount::CreateBySatoshiAmount(value_satoshi));
    } else {
      ConfidentialValue temp_value = ConfidentialValue(value_commitment);
      // unconfidential only
      if (!temp_value.HasBlinding()) value = temp_value;
    }

    // add TxOut
    ElementsAddressFactory address_factory;
    ConfidentialAssetId asset_obj(asset_string);
    ConfidentialNonce nonce_obj;
    if (!IsEmptyString(nonce)) {
      nonce_obj = ConfidentialNonce(std::string(nonce));
    }
    Script locking_script;
    if (!IsEmptyString(address)) {
      const std::string addr(address);
      if (ElementsConfidentialAddress::IsConfidentialAddress(addr)) {
        ElementsConfidentialAddress confidential_addr(addr);
        locking_script = confidential_addr.GetLockingScript();
      } else {
        Address unconfidential_addr = address_factory.GetAddress(addr);
        locking_script = unconfidential_addr.GetLockingScript();
      }
    } else if (!IsEmptyString(direct_locking_script)) {
      locking_script = Script(std::string(direct_locking_script));
    }

    ctx.SetTxOutCommitment(
        index, asset_obj, value, nonce_obj, ByteData(), ByteData());
    *tx_string = CreateString(ctx.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}